

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O2

bool __thiscall BackwardPass::ProcessDef(BackwardPass *this,Opnd *opnd)

{
  BasicBlock *pBVar1;
  Instr *instr;
  Region *region;
  GlobOpt *this_00;
  StackSym **ppSVar2;
  BVSparse<Memory::JitArenaAllocator> *this_01;
  code *pcVar3;
  bool bVar4;
  BOOLEAN BVar5;
  BOOLEAN BVar6;
  bool bVar7;
  bool bVar8;
  RegSlot RVar9;
  BailOutKind BVar10;
  RegOpnd *pRVar11;
  undefined4 *puVar12;
  PropertySym *pPVar13;
  StackSym *pSVar14;
  StackSym *pSVar15;
  SymOpnd *pSVar16;
  PropertySymOpnd *pPVar17;
  Func *pFVar18;
  uint uVar19;
  BackwardPass *pBVar20;
  BackwardPass *defSym;
  byte bVar21;
  
  bVar4 = IR::Opnd::IsRegOpnd(opnd);
  if (bVar4) {
    pRVar11 = IR::Opnd::AsRegOpnd(opnd);
    defSym = (BackwardPass *)pRVar11->m_sym;
    bVar21 = opnd->field_0xb;
    if (((this->isCollectionPass == false) &&
        (InvalidateCloneStrCandidate(this,opnd), this->tag == BackwardPhase)) &&
       (this->currentPrePassLoop != (Loop *)0x0)) {
      pBVar20 = (BackwardPass *)this->currentPrePassLoop->symsAssignedToInLoop;
      BVar5 = BVSparse<Memory::JitArenaAllocator>::TestAndSet
                        ((BVSparse<Memory::JitArenaAllocator> *)pBVar20,
                         *(BVIndex *)&defSym->tempAlloc);
      bVar4 = InstrPreservesNumberValues(pBVar20,this->currentInstr,(Sym *)defSym);
      if (BVar5 == '\0') {
        if (bVar4) {
          BVSparse<Memory::JitArenaAllocator>::Set
                    (this->currentPrePassLoop->preservesNumberValue,*(BVIndex *)&defSym->tempAlloc);
        }
      }
      else if (!bVar4) {
        BVSparse<Memory::JitArenaAllocator>::Clear
                  (this->currentPrePassLoop->preservesNumberValue,*(BVIndex *)&defSym->tempAlloc);
      }
    }
  }
  else {
    bVar4 = IR::Opnd::IsSymOpnd(opnd);
    if (!bVar4) {
      bVar4 = IR::Opnd::IsIndirOpnd(opnd);
      if (!bVar4) {
        return false;
      }
      ProcessUse(this,opnd);
      return false;
    }
    pSVar16 = IR::Opnd::AsSymOpnd(opnd);
    defSym = (BackwardPass *)pSVar16->m_sym;
    bVar21 = opnd->field_0xb;
  }
  pBVar1 = this->currentBlock;
  instr = this->currentInstr;
  if ((instr->m_kind == InstrKindByteCodeUses) && (instr->m_opcode == ByteCodeUses)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar12 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1e81,"(!instr->IsByteCodeUsesInstr())","!instr->IsByteCodeUsesInstr()");
    if (!bVar4) goto LAB_003cc8c2;
    *puVar12 = 0;
  }
  if (*(SymKind *)((long)&defSym->tempAlloc + 4) == SymKindProperty) {
    pPVar13 = Sym::AsPropertySym((Sym *)defSym);
    ProcessStackSymUse(this,pPVar13->m_stackSym,(bVar21 & 8) >> 3);
    if (this->isCollectionPass != false) {
      return false;
    }
    bVar4 = DoDeadStoreSlots(this);
    BVar5 = true;
    if (((bVar4) && ((byte)((pPVar13->super_Sym).field_0x15 - 1) < 2)) &&
       (BVar6 = BVSparse<Memory::JitArenaAllocator>::TestAndSet
                          (pBVar1->slotDeadStoreCandidates,(pPVar13->super_Sym).m_id), BVar6 != '\0'
       )) {
      BVar5 = BVSparse<Memory::JitArenaAllocator>::Test
                        (pBVar1->upwardExposedUses,(pPVar13->super_Sym).m_id);
      if (BVar5 != '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar12 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x1e91,
                           "(isPropertySymUsed || !block->upwardExposedUses->Test(propertySym->m_id))"
                           ,
                           "isPropertySymUsed || !block->upwardExposedUses->Test(propertySym->m_id)"
                          );
        if (!bVar4) goto LAB_003cc8c2;
        *puVar12 = 0;
      }
      BVar5 = BVSparse<Memory::JitArenaAllocator>::Test
                        (pBVar1->upwardExposedUses,(pPVar13->m_stackSym->super_Sym).m_id);
      BVar5 = BVar5 != '\0';
    }
    BVar6 = BVSparse<Memory::JitArenaAllocator>::TestAndClear
                      (pBVar1->upwardExposedFields,(pPVar13->super_Sym).m_id);
    DoSetDead(this,opnd,BVar6 == '\0');
    if (this->tag == BackwardPhase) {
      pSVar16 = IR::Opnd::AsSymOpnd(opnd);
      bVar4 = IR::SymOpnd::IsPropertySymOpnd(pSVar16);
      if (bVar4) {
        this_00 = this->globOpt;
        pPVar17 = IR::Opnd::AsPropertySymOpnd(opnd);
        GlobOpt::PreparePropertySymOpndForTypeCheckSeq
                  (this_00,pPVar17,instr,this->currentBlock->loop);
      }
    }
    pSVar16 = IR::Opnd::AsSymOpnd(opnd);
    bVar4 = IR::SymOpnd::IsPropertySymOpnd(pSVar16);
    if (bVar4) {
      pPVar17 = IR::Opnd::AsPropertySymOpnd(opnd);
      ProcessPropertySymOpndUse(this,pPVar17);
    }
  }
  else {
    if ((instr->m_kind == InstrKindByteCodeUses) && (instr->m_opcode == ByteCodeUses)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar12 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x1ea7,"(!instr->IsByteCodeUsesInstr())","!instr->IsByteCodeUsesInstr()");
      if (!bVar4) {
LAB_003cc8c2:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar12 = 0;
    }
    bVar7 = DoByteCodeUpwardExposedUsed(this);
    bVar4 = true;
    if ((bVar7) && (pSVar14 = Sym::AsStackSym((Sym *)defSym), (pSVar14->field_0x19 & 0x20) != 0)) {
      pSVar14 = Sym::AsStackSym((Sym *)defSym);
      if ((pSVar14->field_0x1a & 1) != 0) {
        pSVar14 = StackSym::GetVarEquivSym(pSVar14,(Func *)0x0);
      }
      region = this->currentRegion;
      if (region == (Region *)0x0) {
        bVar4 = true;
        bVar7 = true;
      }
      else {
        pBVar20 = defSym;
        pSVar15 = Sym::AsStackSym((Sym *)defSym);
        bVar4 = CheckWriteThroughSymInRegion(pBVar20,region,pSVar15);
        bVar7 = CheckWriteThroughSymInRegion(pBVar20,this->currentRegion,pSVar14);
        bVar7 = !bVar7;
        bVar4 = !bVar4;
      }
      if ((bVar21 & 8) == 0) {
        pFVar18 = this->func;
        pSVar15 = Sym::AsStackSym((Sym *)defSym);
        bVar8 = DoDeadStore(pFVar18,pSVar15);
        if ((!bVar8) && (bVar8 = IR::Opnd::IsRegOpnd(opnd), bVar8)) {
          pRVar11 = IR::Opnd::AsRegOpnd(opnd);
          pRVar11->field_0x18 = pRVar11->field_0x18 | 4;
        }
        if (bVar7) {
          BVSparse<Memory::JitArenaAllocator>::Clear
                    (pBVar1->byteCodeUpwardExposedUsed,(pSVar14->super_Sym).m_id);
          pFVar18 = StackSym::GetByteCodeFunc(pSVar14);
          if (pFVar18 == this->func) {
            ppSVar2 = pBVar1->byteCodeRestoreSyms;
            RVar9 = StackSym::GetByteCodeRegSlot(pSVar14);
            ppSVar2[RVar9] = (StackSym *)0x0;
          }
        }
      }
    }
    if (this->isCollectionPass != false) {
      return false;
    }
    bVar7 = IR::Opnd::IsRegOpnd(opnd);
    if (bVar7) {
      pSVar14 = Sym::AsStackSym((Sym *)defSym);
      MarkTemp(this,pSVar14);
    }
    if ((((this->tag == BackwardPhase) && (instr->m_opcode == Ld_A)) &&
        (bVar7 = IR::Opnd::IsRegOpnd(instr->m_src1), bVar7)) &&
       (BVar5 = BVSparse<Memory::JitArenaAllocator>::Test
                          (pBVar1->upwardExposedFields,*(BVIndex *)&defSym->tempAlloc),
       BVar5 != '\0')) {
      this_01 = pBVar1->upwardExposedFields;
      pRVar11 = IR::Opnd::AsRegOpnd(instr->m_src1);
      BVSparse<Memory::JitArenaAllocator>::Set(this_01,(pRVar11->m_sym->super_Sym).m_id);
    }
    if (!bVar4) {
      return false;
    }
    BVar5 = BVSparse<Memory::JitArenaAllocator>::TestAndClear
                      (pBVar1->upwardExposedUses,*(BVIndex *)&defSym->tempAlloc);
  }
  if ((BVar5 == '\0') && (bVar4 = DoDeadStore(this), bVar4)) {
    bVar4 = IR::Instr::HasAnySideEffects(instr);
    if (bVar4) {
      uVar19 = instr->m_opcode - 0x70;
      if (8 < uVar19) {
        return false;
      }
      if ((0x145U >> (uVar19 & 0x1f) & 1) == 0) {
        return false;
      }
    }
    if (((this->currentPrePassLoop == (Loop *)0x0) &&
        ((bVar4 = IR::Opnd::IsRegOpnd(opnd), !bVar4 ||
         (pRVar11 = IR::Opnd::AsRegOpnd(opnd), (pRVar11->field_0x18 & 4) == 0)))) &&
       (((instr->field_0x38 & 0x10) == 0 ||
        ((BVar10 = IR::Instr::GetBailOutKind(instr),
         (BVar10 & BailOutOnResultConditions) == BailOutInvalid &&
         ((uVar19 = (BVar10 & ~BailOutKindBits) - BailOutIntOnly, 0x1e < uVar19 ||
          ((0x78e00027U >> (uVar19 & 0x1f) & 1) == 0)))))))) {
      DeadStoreInstr(this,instr);
      return true;
    }
  }
  return false;
}

Assistant:

bool
BackwardPass::ProcessDef(IR::Opnd * opnd)
{
    BOOLEAN isJITOptimizedReg = false;
    Sym * sym;
    if (opnd->IsRegOpnd())
    {
        sym = opnd->AsRegOpnd()->m_sym;
        isJITOptimizedReg = opnd->GetIsJITOptimizedReg();
        if (!IsCollectionPass())
        {
            this->InvalidateCloneStrCandidate(opnd);
            if ((tag == Js::BackwardPhase) && IsPrePass())
            {
                bool firstDef = !this->currentPrePassLoop->symsAssignedToInLoop->TestAndSet(sym->m_id);

                if (firstDef)
                {
                    if (this->InstrPreservesNumberValues(this->currentInstr, sym))
                    {
                        this->currentPrePassLoop->preservesNumberValue->Set(sym->m_id);
                    }
                }
                else if (!this->InstrPreservesNumberValues(this->currentInstr, sym))
                {
                    this->currentPrePassLoop->preservesNumberValue->Clear(sym->m_id);
                }
            }
        }
    }
    else if (opnd->IsSymOpnd())
    {
        sym = opnd->AsSymOpnd()->m_sym;
        isJITOptimizedReg = opnd->GetIsJITOptimizedReg();
    }
    else
    {
        if (opnd->IsIndirOpnd())
        {
            this->ProcessUse(opnd);
        }
        return false;
    }

    BasicBlock * block = this->currentBlock;
    BOOLEAN isUsed = true;
    BOOLEAN keepSymLiveForException = false;
    BOOLEAN keepVarSymLiveForException = false;
    IR::Instr * instr = this->currentInstr;
    Assert(!instr->IsByteCodeUsesInstr());
    if (sym->IsPropertySym())
    {
        PropertySym *propertySym = sym->AsPropertySym();
        ProcessStackSymUse(propertySym->m_stackSym, isJITOptimizedReg);

        if (IsCollectionPass())
        {
            return false;
        }

        if (this->DoDeadStoreSlots())
        {
            if (propertySym->m_fieldKind == PropertyKindLocalSlots || propertySym->m_fieldKind == PropertyKindSlots)
            {
                BOOLEAN isPropertySymUsed = !block->slotDeadStoreCandidates->TestAndSet(propertySym->m_id);
                Assert(isPropertySymUsed || !block->upwardExposedUses->Test(propertySym->m_id));

                isUsed = isPropertySymUsed || block->upwardExposedUses->Test(propertySym->m_stackSym->m_id);
            }
        }

        this->DoSetDead(opnd, !block->upwardExposedFields->TestAndClear(propertySym->m_id));

        if (tag == Js::BackwardPhase)
        {
            if (opnd->AsSymOpnd()->IsPropertySymOpnd())
            {
                this->globOpt->PreparePropertySymOpndForTypeCheckSeq(opnd->AsPropertySymOpnd(), instr, this->currentBlock->loop);
            }
        }
        if (opnd->AsSymOpnd()->IsPropertySymOpnd())
        {
            this->ProcessPropertySymOpndUse(opnd->AsPropertySymOpnd());
        }
    }
    else
    {
        Assert(!instr->IsByteCodeUsesInstr());

        if (this->DoByteCodeUpwardExposedUsed())
        {
            if (sym->AsStackSym()->HasByteCodeRegSlot())
            {
                StackSym * varSym = sym->AsStackSym();
                if (varSym->IsTypeSpec())
                {
                    // It has to have a var version for byte code regs
                    varSym = varSym->GetVarEquivSym(nullptr);
                }

                if (this->currentRegion)
                {
                    keepSymLiveForException = this->CheckWriteThroughSymInRegion(this->currentRegion, sym->AsStackSym());
                    keepVarSymLiveForException = this->CheckWriteThroughSymInRegion(this->currentRegion, varSym);
                }

                if (!isJITOptimizedReg)
                {
                    if (!DoDeadStore(this->func, sym->AsStackSym()))
                    {
                        // Don't deadstore the bytecodereg sym, so that we could do write to get the locals inspection
                        if (opnd->IsRegOpnd())
                        {
                            opnd->AsRegOpnd()->m_dontDeadStore = true;
                        }
                    }

                    // write through symbols should not be cleared from the byteCodeUpwardExposedUsed BV upon defs in the Try region:
                    //      try
                    //          x =
                    //          <bailout> <-- this bailout should restore x from its first def. This would not happen if x is cleared
                    //                        from byteCodeUpwardExposedUsed when we process its second def
                    //          <exception>
                    //          x =
                    //      catch
                    //          = x
                    if (!keepVarSymLiveForException)
                    {
                        // Always track the sym use on the var sym.
                        block->byteCodeUpwardExposedUsed->Clear(varSym->m_id);
#if DBG
                        // TODO: We can only track first level function stack syms right now
                        if (varSym->GetByteCodeFunc() == this->func)
                        {
                            block->byteCodeRestoreSyms[varSym->GetByteCodeRegSlot()] = nullptr;
                        }
#endif
                    }
                }
            }
        }

        if (IsCollectionPass())
        {
            return false;
        }

        // Don't care about property sym for mark temps
        if (opnd->IsRegOpnd())
        {
            this->MarkTemp(sym->AsStackSym());
        }

        if (this->tag == Js::BackwardPhase &&
            instr->m_opcode == Js::OpCode::Ld_A &&
            instr->GetSrc1()->IsRegOpnd() &&
            block->upwardExposedFields->Test(sym->m_id))
        {
            block->upwardExposedFields->Set(instr->GetSrc1()->AsRegOpnd()->m_sym->m_id);
        }

        if (!keepSymLiveForException)
        {
            isUsed = block->upwardExposedUses->TestAndClear(sym->m_id);
        }
    }

    if (isUsed || !this->DoDeadStore())
    {
        return false;
    }

    // FromVar on a primitive value has no side-effects
    // TODO: There may be more cases where FromVars can be dead-stored, such as cases where they have a bailout that would bail
    // out on non-primitive vars, thereby causing no side effects anyway. However, it needs to be ensured that no assumptions
    // that depend on the bailout are made later in the function.

    // Special case StFld for trackable fields
    bool hasSideEffects = instr->HasAnySideEffects()
        && instr->m_opcode != Js::OpCode::StFld
        && instr->m_opcode != Js::OpCode::StRootFld
        && instr->m_opcode != Js::OpCode::StFldStrict
        && instr->m_opcode != Js::OpCode::StRootFldStrict;

    if (this->IsPrePass() || hasSideEffects)
    {
        return false;
    }

    if (opnd->IsRegOpnd() && opnd->AsRegOpnd()->m_dontDeadStore)
    {
        return false;
    }

    if (instr->HasBailOutInfo())
    {
        // A bailout inserted for aggressive or lossy int type specialization causes assumptions to be made on the value of
        // the instruction's destination later on, as though the bailout did not happen. If the value is an int constant and
        // that value is propagated forward, it can cause the bailout instruction to become a dead store and be removed,
        // thereby invalidating the assumptions made. Or for lossy int type specialization, the lossy conversion to int32
        // may have side effects and so cannot be dead-store-removed. As one way of solving that problem, bailout
        // instructions resulting from aggressive or lossy int type spec are not dead-stored.
        const auto bailOutKind = instr->GetBailOutKind();
        if(bailOutKind & IR::BailOutOnResultConditions)
        {
            return false;
        }
        switch(bailOutKind & ~IR::BailOutKindBits)
        {
            case IR::BailOutIntOnly:
            case IR::BailOutNumberOnly:
            case IR::BailOutExpectingInteger:
            case IR::BailOutPrimitiveButString:
            case IR::BailOutExpectingString:
            case IR::BailOutOnNotPrimitive:
            case IR::BailOutFailedInlineTypeCheck:
            case IR::BailOutOnFloor:
            case IR::BailOnModByPowerOf2:
            case IR::BailOnDivResultNotInt:
            case IR::BailOnIntMin:
                return false;
        }
    }

    // Dead store
    DeadStoreInstr(instr);
    return true;
}